

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O0

Vector3D * __thiscall CGL::UniformHemisphereSampler3D::get_sample(UniformHemisphereSampler3D *this)

{
  Vector3D *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  double dVar6;
  double dVar7;
  double zs;
  double ys;
  double xs;
  double phi;
  double theta;
  double Xi2;
  double Xi1;
  
  dVar6 = random_uniform();
  dVar7 = random_uniform();
  dVar6 = acos(dVar6);
  fVar1 = sinf((float)dVar6);
  fVar2 = cosf((float)(dVar7 * 6.283185307179586));
  fVar3 = sinf((float)dVar6);
  fVar4 = sinf((float)(dVar7 * 6.283185307179586));
  fVar5 = cosf((float)dVar6);
  Vector3D::Vector3D(in_RDI,(double)(fVar1 * fVar2),(double)(fVar3 * fVar4),(double)fVar5);
  return in_RDI;
}

Assistant:

Vector3D UniformHemisphereSampler3D::get_sample() const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double theta = acos(Xi1);
  double phi = 2.0 * PI * Xi2;

  double xs = sinf(theta) * cosf(phi);
  double ys = sinf(theta) * sinf(phi);
  double zs = cosf(theta);

  return Vector3D(xs, ys, zs);

}